

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O2

void Sim_CollectNodes_rec(Abc_Obj_t *pRoot,Vec_Ptr_t *vField)

{
  int iVar1;
  long lVar2;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pRoot);
  if (iVar1 == 0) {
    iVar1 = Abc_NodeIsTravIdPrevious(pRoot);
    if (iVar1 != 0) {
      Abc_NodeSetTravIdCurrent(pRoot);
      for (lVar2 = 0; lVar2 < (pRoot->vFanins).nSize; lVar2 = lVar2 + 1) {
        Sim_CollectNodes_rec
                  ((Abc_Obj_t *)pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[lVar2]],vField);
      }
      if ((*(uint *)&pRoot->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        pRoot->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)(long)vField->nSize;
      }
      Vec_PtrPush(vField,pRoot);
      return;
    }
  }
  return;
}

Assistant:

void Sim_CollectNodes_rec( Abc_Obj_t * pRoot, Vec_Ptr_t * vField )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pRoot) )
        return;
    if ( !Abc_NodeIsTravIdPrevious(pRoot) )
        return;
    Abc_NodeSetTravIdCurrent( pRoot );
    Abc_ObjForEachFanin( pRoot, pFanin, i )
        Sim_CollectNodes_rec( pFanin, vField );
    if ( !Abc_ObjIsCo(pRoot) )
        pRoot->pData = (void *)(ABC_PTRUINT_T)Vec_PtrSize(vField);
    Vec_PtrPush( vField, pRoot );
}